

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

int dwarf_fileline(backtrace_state *state,uintptr_t pc,backtrace_full_callback callback,
                  backtrace_error_callback error_callback,void *data)

{
  int iVar1;
  dwarf_data *ddata;
  int local_34 [2];
  int found;
  
  if (state->threaded != 0) {
    abort();
  }
  ddata = (dwarf_data *)&state->fileline_data;
  do {
    ddata = ddata->next;
    if (ddata == (dwarf_data *)0x0) {
      iVar1 = (*callback)(data,pc,(char *)0x0,0,(char *)0x0);
      return iVar1;
    }
    iVar1 = dwarf_lookup_pc(state,ddata,pc,callback,error_callback,data,local_34);
  } while (local_34[0] == 0 && iVar1 == 0);
  return iVar1;
}

Assistant:

static int
dwarf_fileline (struct backtrace_state *state, uintptr_t pc,
		backtrace_full_callback callback,
		backtrace_error_callback error_callback, void *data)
{
  struct dwarf_data *ddata;
  int found;
  int ret;

  if (!state->threaded)
    {
      for (ddata = (struct dwarf_data *) state->fileline_data;
	   ddata != NULL;
	   ddata = ddata->next)
	{
	  ret = dwarf_lookup_pc (state, ddata, pc, callback, error_callback,
				 data, &found);
	  if (ret != 0 || found)
	    return ret;
	}
    }
  else
    {
      struct dwarf_data **pp;

      pp = (struct dwarf_data **) (void *) &state->fileline_data;
      while (1)
	{
	  ddata = backtrace_atomic_load_pointer (pp);
	  if (ddata == NULL)
	    break;

	  ret = dwarf_lookup_pc (state, ddata, pc, callback, error_callback,
				 data, &found);
	  if (ret != 0 || found)
	    return ret;

	  pp = &ddata->next;
	}
    }

  /* FIXME: See if any libraries have been dlopen'ed.  */

  return callback (data, pc, NULL, 0, NULL);
}